

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void service_start(service *svc,char *dynamic_args)

{
  undefined8 uVar1;
  int iVar2;
  __pid_t _Var3;
  int *piVar4;
  char *pcVar5;
  time_t tVar6;
  char *in_RSI;
  long in_RDI;
  bool bVar7;
  char *bword;
  char *next;
  char *tmp_1;
  int arg_idx;
  char *arg_ptrs [65];
  int s_1;
  int sz;
  int fd;
  char tmp [32];
  svcenvinfo *ei;
  socketinfo *si;
  int n;
  int needs_console;
  pid_t pid;
  stat s;
  char *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  int local_30c;
  char *local_308 [8];
  char *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd4c;
  char *in_stack_fffffffffffffd50;
  gid_t in_stack_fffffffffffffd58;
  uid_t in_stack_fffffffffffffd5c;
  mode_t in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  undefined8 *local_c0;
  undefined8 *local_b8;
  
  *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) & 0xfffffff6;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  if ((*(uint *)(in_RDI + 0x20) & 4) == 0) {
    bVar7 = (*(uint *)(in_RDI + 0x20) & 0x10) == 0;
    if ((bVar7) || (have_console != 0)) {
      iVar2 = stat(*(char **)(in_RDI + 0xe8),(stat *)&stack0xffffffffffffff60);
      if (iVar2 == 0) {
        if (((*(uint *)(in_RDI + 0x20) & 2) == 0) && (in_RSI != (char *)0x0)) {
          log_write(3,"<3>init: service \'%s\' must be one-shot to use dynamic args, disabling\n",
                    *(undefined8 *)(in_RDI + 0xe8));
          *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 1;
        }
        else {
          log_write(5,"<5>init: starting \'%s\'\n",*(undefined8 *)(in_RDI + 0x10));
          _Var3 = fork();
          if (_Var3 == 0) {
            for (local_c0 = *(undefined8 **)(in_RDI + 0x70); local_c0 != (undefined8 *)0x0;
                local_c0 = (undefined8 *)*local_c0) {
              add_environment(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
            }
            for (local_b8 = *(undefined8 **)(in_RDI + 0x68); local_b8 != (undefined8 *)0x0;
                local_b8 = (undefined8 *)*local_b8) {
              strcmp((char *)local_b8[2],"dgram");
              iVar2 = create_socket(in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                                    in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                                    in_stack_fffffffffffffd58);
              if (-1 < iVar2) {
                publish_socket(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
              }
            }
            if (bVar7) {
              zap_stdio();
            }
            else {
              setsid();
            }
            _Var3 = getpid();
            setpgid(0,_Var3);
            if (*(int *)(in_RDI + 0x40) != 0) {
              setgid(*(__gid_t *)(in_RDI + 0x40));
            }
            if (*(long *)(in_RDI + 0x60) != 0) {
              setgroups(*(size_t *)(in_RDI + 0x60),(__gid_t *)(in_RDI + 0x44));
            }
            if (*(int *)(in_RDI + 0x3c) != 0) {
              setuid(*(__uid_t *)(in_RDI + 0x3c));
            }
            if (in_RSI == (char *)0x0) {
              iVar2 = execve(*(char **)(in_RDI + 0xe8),(char **)(in_RDI + 0xe8),ENV);
              if (iVar2 < 0) {
                uVar1 = *(undefined8 *)(in_RDI + 0xe8);
                piVar4 = __errno_location();
                pcVar5 = strerror(*piVar4);
                log_write(3,"<3>init: cannot execve(\'%s\'): %s\n",uVar1,pcVar5);
              }
            }
            else {
              local_30c = *(int *)(in_RDI + 0xe0);
              strdup(in_RSI);
              memcpy(local_308,(void *)(in_RDI + 0xe8),(long)*(int *)(in_RDI + 0xe0) << 3);
              do {
                pcVar5 = strsep((char **)&stack0xfffffffffffffce0," ");
                if (pcVar5 == (char *)0x0) break;
                iVar2 = local_30c + 1;
                local_308[local_30c] = pcVar5;
                local_30c = iVar2;
              } while (iVar2 != 0x40);
              local_308[local_30c] = (char *)0x0;
              execve(*(char **)(in_RDI + 0xe8),local_308,ENV);
            }
            _exit(0x7f);
          }
          if (_Var3 < 0) {
            log_write(3,"<3>init: failed to start \'%s\'\n",*(undefined8 *)(in_RDI + 0x10));
            *(undefined4 *)(in_RDI + 0x24) = 0;
          }
          else {
            tVar6 = gettime();
            *(time_t *)(in_RDI + 0x28) = tVar6;
            *(__pid_t *)(in_RDI + 0x24) = _Var3;
            *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 4;
            notify_service_state(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          }
        }
      }
      else {
        log_write(3,"<3>init: cannot find \'%s\', disabling \'%s\'\n",*(undefined8 *)(in_RDI + 0xe8)
                  ,*(undefined8 *)(in_RDI + 0x10));
        *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 1;
      }
    }
    else {
      log_write(3,"<3>init: service \'%s\' requires console\n",*(undefined8 *)(in_RDI + 0x10));
      *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 1;
    }
  }
  return;
}

Assistant:

void service_start(struct service *svc, const char *dynamic_args)
{
    struct stat s;
    pid_t pid;
    int needs_console;
    int n;

        /* starting a service removes it from the disabled
         * state and immediately takes it out of the restarting
         * state if it was in there
         */
    svc->flags &= (~(SVC_DISABLED|SVC_RESTARTING));
    svc->time_started = 0;
    
        /* running processes require no additional work -- if
         * they're in the process of exiting, we've ensured
         * that they will immediately restart on exit, unless
         * they are ONESHOT
         */
    if (svc->flags & SVC_RUNNING) {
        return;
    }

    needs_console = (svc->flags & SVC_CONSOLE) ? 1 : 0;
    if (needs_console && (!have_console)) {
        ERROR("service '%s' requires console\n", svc->name);
        svc->flags |= SVC_DISABLED;
        return;
    }

    if (stat(svc->args[0], &s) != 0) {
        ERROR("cannot find '%s', disabling '%s'\n", svc->args[0], svc->name);
        svc->flags |= SVC_DISABLED;
        return;
    }

    if ((!(svc->flags & SVC_ONESHOT)) && dynamic_args) {
        ERROR("service '%s' must be one-shot to use dynamic args, disabling\n",
               svc->args[0]);
        svc->flags |= SVC_DISABLED;
        return;
    }

    NOTICE("starting '%s'\n", svc->name);

    pid = fork();

    if (pid == 0) {
        struct socketinfo *si;
        struct svcenvinfo *ei;
        char tmp[32];
        int fd, sz;

        for (ei = svc->envvars; ei; ei = ei->next)
            add_environment(ei->name, ei->value);

        for (si = svc->sockets; si; si = si->next) {
            int s = create_socket(si->name,
                                  !strcmp(si->type, "dgram") ? 
                                  SOCK_DGRAM : SOCK_STREAM,
                                  si->perm, si->uid, si->gid);
            if (s >= 0) {
                publish_socket(si->name, s);
            }
        }

        if (needs_console) {
            setsid();
//            open_console();
        } else {
            zap_stdio();
        }

#if 0
        for (n = 0; svc->args[n]; n++) {
            INFO("args[%d] = '%s'\n", n, svc->args[n]);
        }
        for (n = 0; ENV[n]; n++) {
            INFO("env[%d] = '%s'\n", n, ENV[n]);
        }
#endif

        setpgid(0, getpid());

    /* as requested, set our gid, supplemental gids, and uid */
        if (svc->gid) {
            setgid(svc->gid);
        }
        if (svc->nr_supp_gids) {
            setgroups(svc->nr_supp_gids, svc->supp_gids);
        }
        if (svc->uid) {
            setuid(svc->uid);
        }

        if (!dynamic_args) {
            if (execve(svc->args[0], (char**) svc->args, (char**) ENV) < 0) {
                ERROR("cannot execve('%s'): %s\n", svc->args[0], strerror(errno));
            }
        } else {
            char *arg_ptrs[SVC_MAXARGS+1];
            int arg_idx = svc->nargs;
            char *tmp = strdup(dynamic_args);
            char *next = tmp;
            char *bword;

            /* Copy the static arguments */
            memcpy(arg_ptrs, svc->args, (svc->nargs * sizeof(char *)));

            while((bword = strsep(&next, " "))) {
                arg_ptrs[arg_idx++] = bword;
                if (arg_idx == SVC_MAXARGS)
                    break;
            }
            arg_ptrs[arg_idx] = '\0';
            execve(svc->args[0], (char**) arg_ptrs, (char**) ENV);
        }
        _exit(127);
    }

    if (pid < 0) {
        ERROR("failed to start '%s'\n", svc->name);
        svc->pid = 0;
        return;
    }

    svc->time_started = gettime();
    svc->pid = pid;
    svc->flags |= SVC_RUNNING;

    notify_service_state(svc->name, "running");
}